

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  byte *pbVar6;
  Location pCVar7;
  long lVar8;
  
  pbVar6 = (byte *)this->current_;
  while (((pbVar6 != (byte *)this->end_ && ((ulong)*pbVar6 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    this->current_ = (Location)pbVar6;
  }
  token->start_ = (Location)pbVar6;
  pbVar6 = (byte *)this->current_;
  if (pbVar6 == (byte *)this->end_) {
LAB_00128518:
    token->type_ = tokenEndOfStream;
    goto LAB_0012851e;
  }
  this->current_ = (Location)(pbVar6 + 1);
  bVar2 = *pbVar6;
  if (0x5a < bVar2) {
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x5b) {
        token->type_ = tokenArrayBegin;
      }
      else {
        if (bVar2 != 0x5d) {
          if (bVar2 == 0x66) {
            token->type_ = tokenFalse;
            pCVar7 = this->current_;
            if (3 < (long)this->end_ - (long)pCVar7) {
              lVar8 = 3;
              do {
                if (lVar8 == -1) {
                  pCVar7 = pCVar7 + 4;
                  goto LAB_001285e3;
                }
                pcVar1 = pCVar7 + lVar8;
                lVar3 = lVar8 + 1;
                lVar8 = lVar8 + -1;
              } while (*pcVar1 == "false"[lVar3]);
            }
          }
          goto switchD_0012840c_caseD_23;
        }
        token->type_ = tokenArrayEnd;
      }
    }
    else {
      if (bVar2 < 0x7b) {
        if (bVar2 == 0x6e) {
          token->type_ = tokenNull;
          pCVar7 = this->current_;
          if (2 < (long)this->end_ - (long)pCVar7) {
            lVar8 = 2;
            do {
              if (lVar8 == -1) goto LAB_001285d9;
              pcVar1 = pCVar7 + lVar8;
              lVar3 = lVar8 + 1;
              lVar8 = lVar8 + -1;
            } while (*pcVar1 == "null"[lVar3]);
          }
        }
        else if (bVar2 == 0x74) {
          token->type_ = tokenTrue;
          pCVar7 = this->current_;
          if (2 < (long)this->end_ - (long)pCVar7) {
            lVar8 = 2;
            do {
              if (lVar8 == -1) goto LAB_001285d9;
              pcVar1 = pCVar7 + lVar8;
              lVar3 = lVar8 + 1;
              lVar8 = lVar8 + -1;
            } while (*pcVar1 == "true"[lVar3]);
          }
        }
        goto switchD_0012840c_caseD_23;
      }
      if (bVar2 == 0x7d) {
        token->type_ = tokenObjectEnd;
      }
      else {
        if (bVar2 != 0x7b) goto switchD_0012840c_caseD_23;
        token->type_ = tokenObjectBegin;
      }
    }
    goto LAB_0012851e;
  }
  switch(bVar2) {
  case 0x22:
    token->type_ = tokenString;
    bVar5 = readString(this);
    goto LAB_00128551;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_0012851e;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this);
    goto LAB_0012851e;
  case 0x2f:
    token->type_ = tokenComment;
    bVar5 = readComment(this);
LAB_00128551:
    bVar4 = true;
    if (bVar5 != false) goto LAB_00128520;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
LAB_0012851e:
    bVar4 = true;
    goto LAB_00128520;
  default:
    if (bVar2 == 0) goto LAB_00128518;
  }
switchD_0012840c_caseD_23:
  token->type_ = tokenError;
  bVar4 = false;
LAB_00128520:
  token->end_ = this->current_;
  return bVar4;
LAB_001285d9:
  pCVar7 = pCVar7 + 3;
LAB_001285e3:
  this->current_ = pCVar7;
  goto LAB_0012851e;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}